

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONState.cxx
# Opt level: O2

void __thiscall cmJSONState::AddErrorAtOffset(cmJSONState *this,string *errMsg,ptrdiff_t offset)

{
  Location loc;
  Location local_18;
  
  if ((this->doc)._M_string_length != 0) {
    local_18 = LocateInDocument(this,offset);
    std::vector<cmJSONState::Error,std::allocator<cmJSONState::Error>>::
    emplace_back<cmJSONState::Location&,std::__cxx11::string_const&>
              ((vector<cmJSONState::Error,std::allocator<cmJSONState::Error>> *)&this->errors,
               &local_18,errMsg);
    return;
  }
  std::vector<cmJSONState::Error,std::allocator<cmJSONState::Error>>::
  emplace_back<std::__cxx11::string_const&>
            ((vector<cmJSONState::Error,std::allocator<cmJSONState::Error>> *)&this->errors,errMsg);
  return;
}

Assistant:

void cmJSONState::AddErrorAtOffset(std::string const& errMsg,
                                   std::ptrdiff_t offset)
{
  if (doc.empty()) {
    this->AddError(errMsg);
  } else {
    Location loc = LocateInDocument(offset);
    this->errors.emplace_back(loc, errMsg);
  }
}